

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.hpp
# Opt level: O1

void __thiscall Shader::Shader(Shader *this,char *vertexPath,char *fragmentPath,char *geometryPath)

{
  long lVar1;
  GLuint shader;
  GLuint shader_00;
  GLuint shader_01;
  GLuint GVar2;
  string geometryCode;
  string fragmentCode;
  string vertexCode;
  stringstream gShaderStream;
  failure e;
  char *fShaderCode;
  ifstream gShaderFile;
  ifstream fShaderFile;
  ifstream vShaderFile;
  char *local_be8;
  ostream *local_be0;
  undefined8 local_bd8;
  ostream local_bd0 [16];
  GLchar *local_bc0;
  undefined8 local_bb8;
  GLchar local_bb0 [16];
  GLchar *local_ba0;
  undefined8 local_b98;
  GLchar local_b90 [16];
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  ostream *local_ae0 [2];
  ostream local_ad0 [112];
  ios_base local_a60 [264];
  GLchar *local_958 [2];
  ostream local_948 [112];
  ios_base aiStack_8d8 [264];
  GLchar *local_7d0 [2];
  ostream local_7c0 [112];
  ios_base aiStack_750 [264];
  long local_648 [2];
  streambuf local_638 [12];
  undefined4 auStack_62c [123];
  long local_440 [2];
  streambuf local_430 [12];
  undefined4 auStack_424 [123];
  long local_238 [2];
  streambuf local_228 [12];
  undefined4 auStack_21c [123];
  
  local_ba0 = local_b90;
  local_b98 = 0;
  local_b90[0] = '\0';
  local_bc0 = local_bb0;
  local_bb8 = 0;
  local_bb0[0] = '\0';
  local_be0 = local_bd0;
  local_bd8 = 0;
  local_bd0[0] = (ostream)0x0;
  local_be8 = geometryPath;
  std::ifstream::ifstream(local_238);
  std::ifstream::ifstream(local_440);
  std::ifstream::ifstream(local_648);
  lVar1 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar1) = 5;
  std::ios::clear((int)&local_be8 + (int)lVar1 + 0x9b0);
  lVar1 = *(long *)(local_440[0] + -0x18);
  *(undefined4 *)((long)auStack_424 + lVar1) = 5;
  std::ios::clear((int)&local_be8 + (int)lVar1 + 0x7a8);
  lVar1 = *(long *)(local_648[0] + -0x18);
  *(undefined4 *)((long)auStack_62c + lVar1) = 5;
  std::ios::clear((int)&local_be8 + (int)lVar1 + 0x5a0);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)vertexPath);
  std::ifstream::open((char *)local_440,(_Ios_Openmode)fragmentPath);
  std::__cxx11::stringstream::stringstream((stringstream *)local_958);
  std::__cxx11::stringstream::stringstream((stringstream *)local_7d0);
  std::ostream::operator<<(local_948,local_228);
  std::ostream::operator<<(local_7c0,local_430);
  std::ifstream::close();
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_ba0,(string *)local_ae0);
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_bc0,(string *)local_ae0);
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0]);
  }
  if (local_be8 != (char *)0x0) {
    std::ifstream::open((char *)local_648,(_Ios_Openmode)local_be8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_ae0);
    std::ostream::operator<<(local_ad0,local_638);
    std::ifstream::close();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_be0,(string *)local_b00);
    if (local_b00[0] != local_af0) {
      operator_delete(local_b00[0]);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_ae0);
    std::ios_base::~ios_base(local_a60);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_7d0);
  std::ios_base::~ios_base(aiStack_750);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_958);
  std::ios_base::~ios_base(aiStack_8d8);
  local_958[0] = local_ba0;
  local_7d0[0] = local_bc0;
  shader = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(shader,1,local_958,(GLint *)0x0);
  (*glad_glCompileShader)(shader);
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"VERTEX","");
  checkCompileErrors(this,shader,&local_b20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p);
  }
  shader_00 = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(shader_00,1,local_7d0,(GLint *)0x0);
  (*glad_glCompileShader)(shader_00);
  shader_01 = 0x1bf190;
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"FRAGMENT","");
  checkCompileErrors(this,shader_00,&local_b40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p);
  }
  if (local_be8 != (char *)0x0) {
    local_ae0[0] = local_be0;
    shader_01 = (*glad_glCreateShader)(0x8dd9);
    (*glad_glShaderSource)(shader_01,1,(GLchar **)local_ae0,(GLint *)0x0);
    (*glad_glCompileShader)(shader_01);
    local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b60,"GEOMETRY","");
    checkCompileErrors(this,shader_01,&local_b60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
      operator_delete(local_b60._M_dataplus._M_p);
    }
  }
  GVar2 = (*glad_glCreateProgram)();
  this->ID = GVar2;
  (*glad_glAttachShader)(GVar2,shader);
  (*glad_glAttachShader)(this->ID,shader_00);
  if (local_be8 != (char *)0x0) {
    (*glad_glAttachShader)(this->ID,shader_01);
  }
  (*glad_glLinkProgram)(this->ID);
  GVar2 = this->ID;
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"PROGRAM","");
  checkCompileErrors(this,GVar2,&local_b80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p);
  }
  (*glad_glDeleteShader)(shader);
  (*glad_glDeleteShader)(shader_00);
  if (local_be8 != (char *)0x0) {
    (*glad_glDeleteShader)(shader_01);
  }
  std::ifstream::~ifstream(local_648);
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  if (local_be0 != local_bd0) {
    operator_delete(local_be0);
  }
  if (local_bc0 != local_bb0) {
    operator_delete(local_bc0);
  }
  if (local_ba0 != local_b90) {
    operator_delete(local_ba0);
  }
  return;
}

Assistant:

Shader(const char* vertexPath, const char* fragmentPath, const char* geometryPath = nullptr) {
        // 1. retrieve the vertex/fragment source code from filePath
        std::string vertexCode;
        std::string fragmentCode;
        std::string geometryCode;
        std::ifstream vShaderFile;
        std::ifstream fShaderFile;
        std::ifstream gShaderFile;
        // ensure ifstream objects can throw exceptions:
        vShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        fShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        gShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        try {
            // open files
            vShaderFile.open(vertexPath);
            fShaderFile.open(fragmentPath);
            std::stringstream vShaderStream, fShaderStream;
            // read file's buffer contents into streams
            vShaderStream << vShaderFile.rdbuf();
            fShaderStream << fShaderFile.rdbuf();		
            // close file handlers
            vShaderFile.close();
            fShaderFile.close();
            // convert stream into string
            vertexCode = vShaderStream.str();
            fragmentCode = fShaderStream.str();			
            // if geometry shader path is present, also load a geometry shader
            if(geometryPath != nullptr)
            {
                gShaderFile.open(geometryPath);
                std::stringstream gShaderStream;
                gShaderStream << gShaderFile.rdbuf();
                gShaderFile.close();
                geometryCode = gShaderStream.str();
            }
        } catch (std::ifstream::failure e) {
            std::cout << "ERROR::SHADER::FILE_NOT_SUCCESFULLY_READ" << std::endl;
        }
        const char* vShaderCode = vertexCode.c_str();
        const char * fShaderCode = fragmentCode.c_str();
        // 2. compile shaders
        unsigned int vertex, fragment;
        // vertex shader
        vertex = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex, 1, &vShaderCode, NULL);
        glCompileShader(vertex);
        checkCompileErrors(vertex, "VERTEX");
        // fragment Shader
        fragment = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment, 1, &fShaderCode, NULL);
        glCompileShader(fragment);
        checkCompileErrors(fragment, "FRAGMENT");
        // if geometry shader is given, compile geometry shader
        unsigned int geometry;
        if(geometryPath != nullptr) {
            const char * gShaderCode = geometryCode.c_str();
            geometry = glCreateShader(GL_GEOMETRY_SHADER);
            glShaderSource(geometry, 1, &gShaderCode, NULL);
            glCompileShader(geometry);
            checkCompileErrors(geometry, "GEOMETRY");
        }
        // shader Program
        ID = glCreateProgram();
        glAttachShader(ID, vertex);
        glAttachShader(ID, fragment);
        if(geometryPath != nullptr)
            glAttachShader(ID, geometry);
        glLinkProgram(ID);
        checkCompileErrors(ID, "PROGRAM");
        // delete the shaders as they're linked into our program now and no longer necessery
        glDeleteShader(vertex);
        glDeleteShader(fragment);
        if(geometryPath != nullptr)
            glDeleteShader(geometry);

    }